

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

void __thiscall
ON_ClassArray<ON_SubDEdgePtr>::Append(ON_ClassArray<ON_SubDEdgePtr> *this,ON_SubDEdgePtr *x)

{
  ON__UINT_PTR OVar1;
  uint uVar2;
  ON_SubDEdgePtr *pOVar3;
  uint uVar4;
  int iVar5;
  
  uVar2 = this->m_count;
  if (uVar2 == this->m_capacity) {
    if ((int)uVar2 < 8 || (ulong)((long)(int)uVar2 << 3) < 0x10000001) {
      uVar4 = 4;
      if (2 < (int)uVar2) {
        uVar4 = uVar2 * 2;
      }
    }
    else {
      uVar4 = 0x2000008;
      if (uVar2 < 0x2000008) {
        uVar4 = uVar2;
      }
      uVar4 = uVar4 + uVar2;
    }
    pOVar3 = this->m_a;
    if ((pOVar3 != (ON_SubDEdgePtr *)0x0) &&
       (iVar5 = (int)((ulong)((long)x - (long)pOVar3) >> 3), iVar5 < (int)uVar2 && -1 < iVar5)) {
      OVar1 = x->m_ptr;
      if (uVar2 < uVar4) {
        SetCapacity(this,(long)(int)uVar4);
        pOVar3 = this->m_a;
        if (pOVar3 == (ON_SubDEdgePtr *)0x0) {
          iVar5 = 0x6bc;
          goto LAB_00610a06;
        }
      }
      iVar5 = this->m_count;
      this->m_count = iVar5 + 1;
      pOVar3[iVar5].m_ptr = OVar1;
      return;
    }
    if (uVar2 < uVar4) {
      SetCapacity(this,(long)(int)uVar4);
      pOVar3 = this->m_a;
    }
    if (pOVar3 == (ON_SubDEdgePtr *)0x0) {
      iVar5 = 0x6c6;
LAB_00610a06:
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,iVar5,"","allocation failure");
      return;
    }
    uVar2 = this->m_count;
  }
  else {
    pOVar3 = this->m_a;
  }
  this->m_count = uVar2 + 1;
  pOVar3[(int)uVar2].m_ptr = x->m_ptr;
  return;
}

Assistant:

void ON_ClassArray<T>::Append( const T& x ) 
{
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if (m_a)
    {
      const int s = (int)(&x - m_a); // (int) cast is for 64 bit pointers
      if ( s >= 0 && s < m_capacity )
      {
        // 26 Sep 2005 Dale Lear
        //    User passed in an element of the m_a[]
        //    that will get reallocated by the call
        //    to Reserve(newcapacity).
        T temp;   // ON_*Array<> templates do not require robust copy constructor.
        temp = x; // ON_*Array<> templates require a robust operator=.
        Reserve( newcapacity );
        if (nullptr == m_a)
        {
          ON_ERROR("allocation failure");
          return;
        }
        m_a[m_count++] = temp;
        return;
      }
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = x;
}